

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

idx_t duckdb::BinaryExecutor::
      SelectFlatLoopSwitch<unsigned_long,unsigned_long,duckdb::Equals,true,false>
                (unsigned_long *ldata,unsigned_long *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  long in_R9;
  long in_stack_00000008;
  SelectionVector *in_stack_00000048;
  idx_t in_stack_00000058;
  SelectionVector *in_stack_00000060;
  unsigned_long *in_stack_00000068;
  unsigned_long *in_stack_00000070;
  SelectionVector *in_stack_00000080;
  undefined8 local_8;
  
  if ((in_R9 == 0) || (in_stack_00000008 == 0)) {
    if (in_R9 == 0) {
      local_8 = SelectFlatLoop<unsigned_long,unsigned_long,duckdb::Equals,true,false,false,true>
                          (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058,
                           (ValidityMask *)false_sel,in_stack_00000048,in_stack_00000080);
    }
    else {
      local_8 = SelectFlatLoop<unsigned_long,unsigned_long,duckdb::Equals,true,false,true,false>
                          (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058,
                           (ValidityMask *)false_sel,in_stack_00000048,in_stack_00000080);
    }
  }
  else {
    local_8 = SelectFlatLoop<unsigned_long,unsigned_long,duckdb::Equals,true,false,true,true>
                        (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058,
                         (ValidityMask *)false_sel,in_stack_00000048,in_stack_00000080);
  }
  return local_8;
}

Assistant:

static inline idx_t SelectFlatLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                         const SelectionVector *sel, idx_t count, ValidityMask &mask,
	                                         SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else if (true_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, false>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, false, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		}
	}